

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::removeAlmostSignExt(OptimizeInstructions *this,Binary *outer)

{
  bool bVar1;
  Binary *pBVar2;
  Const *pCVar3;
  Const *pCVar4;
  Binary *pBVar5;
  Literal *other;
  Literal local_40;
  
  pBVar2 = Expression::cast<wasm::Binary>(outer->left);
  pCVar3 = Expression::cast<wasm::Const>(outer->right);
  pCVar4 = Expression::cast<wasm::Const>(pBVar2->right);
  pBVar5 = (Binary *)pBVar2->left;
  other = &pCVar4->value;
  bVar1 = Literal::operator==(&pCVar3->value,other);
  if (!bVar1) {
    Literal::sub(&local_40,other,&pCVar3->value);
    Literal::operator=(other,&local_40);
    Literal::~Literal(&local_40);
    pBVar5 = pBVar2;
  }
  return (Expression *)pBVar5;
}

Assistant:

Expression* removeAlmostSignExt(Binary* outer) {
    auto* inner = outer->left->cast<Binary>();
    auto* outerConst = outer->right->cast<Const>();
    auto* innerConst = inner->right->cast<Const>();
    auto* value = inner->left;
    if (outerConst->value == innerConst->value) {
      return value;
    }
    // add a shift, by reusing the existing node
    innerConst->value = innerConst->value.sub(outerConst->value);
    return inner;
  }